

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O0

void __thiscall
TPZFYsmpMatrix<double>::AddKelOld
          (TPZFYsmpMatrix<double> *this,TPZFMatrix<double> *elmat,TPZVec<int> *destinationindex)

{
  double dVar1;
  _func_int **pp_Var2;
  bool bVar3;
  bool bVar4;
  int *piVar5;
  long *plVar6;
  double *pdVar7;
  ostream *poVar8;
  reference ppVar9;
  TPZVec<int> *in_RDX;
  long in_RDI;
  pair<long,_long> pVar10;
  iterator itelmat2_1;
  int64_t *iptr_1;
  iterator itelmat2;
  int64_t *iptr;
  int64_t jel;
  iterator itelmat;
  int64_t *AptrLast;
  int64_t *Aptr;
  int64_t jlast;
  int64_t jfirst;
  iterator hint;
  multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> mapindex;
  int64_t nel;
  int64_t ilocal;
  int64_t j;
  int64_t i;
  pair<long,_long> *in_stack_fffffffffffffdc8;
  ostream *in_stack_fffffffffffffdd0;
  const_iterator in_stack_fffffffffffffdd8;
  ostream *in_stack_fffffffffffffde0;
  ostream *in_stack_fffffffffffffde8;
  TPZFMatrix<double> *in_stack_fffffffffffffdf0;
  _Self local_118;
  _Self local_110;
  TPZFMatrix<double> *local_108;
  _Base_ptr local_100;
  _Self local_f8;
  _Self local_f0;
  TPZFMatrix<double> *local_e8;
  _Self local_e0;
  _Base_ptr local_d8;
  long local_d0;
  _Self local_c8;
  TPZFMatrix<double> *local_c0;
  TPZFMatrix<double> *local_b8;
  int64_t local_b0;
  int64_t local_a8;
  pair<long,_long> local_a0;
  _Rb_tree_const_iterator<std::pair<const_long,_long>_> local_90;
  _Base_ptr local_88;
  iterator local_70 [7];
  int64_t local_38;
  long local_30;
  long local_28;
  long local_20;
  TPZVec<int> *local_18;
  
  local_20 = 0;
  local_28 = 0;
  local_30 = 0;
  local_18 = in_RDX;
  local_38 = TPZVec<int>::NElements(in_RDX);
  std::multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
  multimap((multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
           0x1478f45);
  local_70[0]._M_node =
       (_Base_ptr)
       std::multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
       begin((multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *
             )in_stack_fffffffffffffdc8);
  for (local_20 = 0; local_20 < local_38; local_20 = local_20 + 1) {
    piVar5 = TPZVec<int>::operator[](local_18,local_20);
    local_30 = (long)*piVar5;
    std::_Rb_tree_const_iterator<std::pair<const_long,_long>_>::_Rb_tree_const_iterator
              (&local_90,local_70);
    pVar10 = std::make_pair<long&,long&>
                       ((long *)in_stack_fffffffffffffdd0,&in_stack_fffffffffffffdc8->first);
    local_a0 = pVar10;
    local_88 = (_Base_ptr)
               std::multimap<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>::
               insert<std::pair<long,long>>
                         ((multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                           *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8,
                          in_stack_fffffffffffffdc8);
    local_70[0]._M_node = local_88;
  }
  for (local_20 = 0; local_20 < local_38; local_20 = local_20 + 1) {
    piVar5 = TPZVec<int>::operator[](local_18,local_20);
    local_30 = (long)*piVar5;
    plVar6 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x20),local_30);
    local_a8 = *plVar6;
    plVar6 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x20),local_30 + 1);
    local_b0 = *plVar6;
    local_b8 = (TPZFMatrix<double> *)
               TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_a8);
    local_c0 = (TPZFMatrix<double> *)
               TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_b0);
    local_28 = 0;
    local_c8._M_node =
         (_Base_ptr)
         std::multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
         begin((multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                *)in_stack_fffffffffffffdc8);
    while (local_28 < local_38 && local_b8 != local_c0) {
      pp_Var2 = (local_b8->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable;
      ppVar9 = std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)0x147923f);
      if (pp_Var2 == (_func_int **)ppVar9->first) {
        ppVar9 = std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator*
                           ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)0x1479260);
        local_d0 = ppVar9->second;
        pdVar7 = TPZFMatrix<double>::operator()
                           (in_stack_fffffffffffffdf0,(int64_t)in_stack_fffffffffffffde8,
                            (int64_t)in_stack_fffffffffffffde0);
        dVar1 = *pdVar7;
        pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x60),local_a8);
        *pdVar7 = dVar1 + *pdVar7;
        local_d8 = (_Base_ptr)
                   std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator++
                             (in_stack_fffffffffffffdd8._M_node,
                              (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
        local_e0._M_node =
             (_Base_ptr)
             std::
             multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             end((multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                  *)in_stack_fffffffffffffdc8);
        bVar3 = std::operator!=(&local_c8,&local_e0);
        bVar4 = false;
        if (bVar3) {
          ppVar9 = std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator*
                             ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)0x1479344);
          bVar4 = ppVar9->second != local_d0;
        }
        if (bVar4) {
          local_b8 = (TPZFMatrix<double> *)
                     &(local_b8->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          local_a8 = local_a8 + 1;
        }
        local_28 = local_28 + 1;
      }
      else {
        pp_Var2 = (local_b8->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable;
        ppVar9 = std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator*
                           ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)0x14793c8);
        if ((long)pp_Var2 < ppVar9->first) {
          local_b8 = (TPZFMatrix<double> *)
                     &(local_b8->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          local_a8 = local_a8 + 1;
        }
        else {
          pp_Var2 = (local_b8->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                    _vptr_TPZSavable;
          ppVar9 = std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator*
                             ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)0x1479425);
          if (ppVar9->second < (long)pp_Var2) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "virtual void TPZFYsmpMatrix<double>::AddKelOld(TPZFMatrix<TVar> &, TPZVec<int> &) [TVar = double]"
                                    );
            std::operator<<(poVar8," inconsistent\n");
            local_e8 = (TPZFMatrix<double> *)
                       TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_a8);
            for (; local_e8 < local_c0;
                local_e8 = (TPZFMatrix<double> *)
                           &(local_e8->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) {
              poVar8 = (ostream *)
                       std::ostream::operator<<
                                 (&std::cout,
                                  (long)(local_e8->super_TPZMatrix<double>).super_TPZBaseMatrix.
                                        super_TPZSavable._vptr_TPZSavable);
              std::operator<<(poVar8," ");
            }
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            local_f0._M_node =
                 (_Base_ptr)
                 std::
                 multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                 ::begin((multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                          *)in_stack_fffffffffffffdc8);
            while( true ) {
              local_f8._M_node =
                   (_Base_ptr)
                   std::
                   multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                   ::end((multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                          *)in_stack_fffffffffffffdc8);
              bVar4 = std::operator!=(&local_f0,&local_f8);
              if (!bVar4) break;
              ppVar9 = std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator*
                                 ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)0x147955d);
              poVar8 = (ostream *)std::ostream::operator<<(&std::cout,ppVar9->first);
              poVar8 = std::operator<<(poVar8,"/");
              ppVar9 = std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator*
                                 ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)0x1479598);
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,ppVar9->second);
              std::operator<<(poVar8," ");
              local_100 = (_Base_ptr)
                          std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator++
                                    (in_stack_fffffffffffffdd8._M_node,
                                     (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
            }
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          }
        }
      }
    }
    if (local_28 != local_38) {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "virtual void TPZFYsmpMatrix<double>::AddKelOld(TPZFMatrix<TVar> &, TPZVec<int> &) [TVar = double]"
                              );
      poVar8 = std::operator<<(poVar8," inconsistent2 j = ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_28);
      poVar8 = std::operator<<(poVar8," nel ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_38);
      std::operator<<(poVar8,"\n");
      in_stack_fffffffffffffdf0 =
           (TPZFMatrix<double> *)TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_a8);
      for (local_108 = in_stack_fffffffffffffdf0; local_108 < local_c0;
          local_108 = (TPZFMatrix<double> *)
                      &(local_108->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) {
        in_stack_fffffffffffffde8 =
             (ostream *)
             std::ostream::operator<<
                       (&std::cout,
                        (long)(local_108->super_TPZMatrix<double>).super_TPZBaseMatrix.
                              super_TPZSavable._vptr_TPZSavable);
        std::operator<<(in_stack_fffffffffffffde8," ");
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      local_110._M_node =
           (_Base_ptr)
           std::multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
           ::begin((multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                    *)in_stack_fffffffffffffdc8);
      while( true ) {
        local_118._M_node =
             (_Base_ptr)
             std::
             multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             end((multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                  *)in_stack_fffffffffffffdc8);
        bVar4 = std::operator!=(&local_110,&local_118);
        if (!bVar4) break;
        ppVar9 = std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator*
                           ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)0x1479793);
        in_stack_fffffffffffffde0 = (ostream *)std::ostream::operator<<(&std::cout,ppVar9->first);
        in_stack_fffffffffffffdd8._M_node =
             (_Base_ptr)std::operator<<(in_stack_fffffffffffffde0,"/");
        ppVar9 = std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator*
                           ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)0x14797ce);
        in_stack_fffffffffffffdd0 =
             (ostream *)std::ostream::operator<<(in_stack_fffffffffffffdd8._M_node,ppVar9->second);
        std::operator<<(in_stack_fffffffffffffdd0," ");
        std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)
                   in_stack_fffffffffffffdd8._M_node,(int)((ulong)in_stack_fffffffffffffdd0 >> 0x20)
                  );
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  std::multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
  ~multimap((multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
            0x1479853);
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::AddKelOld(TPZFMatrix<TVar> & elmat, TPZVec < int > & destinationindex){
	int64_t i=0;
	int64_t j=0;
	int64_t ilocal=0;
	//  int jlocal=0;
	int64_t nel = destinationindex.NElements();
	std::multimap<int64_t,int64_t> mapindex;
	std::multimap<int64_t,int64_t>::iterator hint = mapindex.begin();
	for(i=0;i<nel;i++){
		ilocal = destinationindex[i];
		hint = mapindex.insert(hint,std::make_pair(ilocal,i));
		//    mapindex[ilocal] = i;
	}
	for(i=0;i<nel;i++){
		ilocal = destinationindex[i];
		int64_t jfirst = fIA[ilocal];
		int64_t jlast = fIA[ilocal+1];
		int64_t *Aptr = &fJA[jfirst];
		int64_t *AptrLast = &fJA[jlast];
		j=0;
		std::multimap<int64_t,int64_t>::iterator itelmat = mapindex.begin();
		while(j<nel && Aptr != AptrLast)
		{
			if(*Aptr == (*itelmat).first)
			{
				int64_t jel = (*itelmat).second;
				fA[jfirst] += elmat(i,jel);
				itelmat++;
				if(itelmat != mapindex.end() && (*itelmat).second != jel)
				{
					Aptr++;
					jfirst++;
				}
				j++;
			}
			else if(*Aptr < (*itelmat).first)
			{
				Aptr++;
				jfirst++;
			}
			else if(*Aptr > (*itelmat).second)
			{
				std::cout << __PRETTY_FUNCTION__ << " inconsistent\n";
				int64_t *iptr = &fJA[jfirst];
				while(iptr < AptrLast) 
				{
					cout << *iptr << " ";
					iptr++;
				}
				cout << endl;
				std::multimap<int64_t,int64_t>::iterator itelmat2 = mapindex.begin();
				for(;itelmat2 != mapindex.end(); itelmat2++)
				{
					cout << (*itelmat2).first << "/" << (*itelmat2).second << " ";
				}
				cout << endl;
				
			}
		}
		if(j!= nel)
		{
			std::cout << __PRETTY_FUNCTION__ << " inconsistent2 j = " << j << " nel " << nel << "\n";
			int64_t *iptr = &fJA[jfirst];
			while(iptr < AptrLast) 
			{
				cout << *iptr << " ";
				iptr++;
			}
			cout << endl;
			std::multimap<int64_t,int64_t>::iterator itelmat2 = mapindex.begin();
			for(;itelmat2 != mapindex.end(); itelmat2++)
			{
				cout << (*itelmat2).first << "/" << (*itelmat2).second << " ";
			}
			cout << endl;
		}
	}
	
}